

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O0

string * de::toUpper(string *__return_storage_ptr__,string *str)

{
  ToUpper local_60 [3];
  char *local_48;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined1 local_19;
  string *local_18;
  string *str_local;
  string *ret;
  
  local_19 = 0;
  local_18 = str;
  str_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)std::__cxx11::string::end();
  local_48 = (char *)std::__cxx11::string::begin();
  local_40 = std::inserter<std::__cxx11::string>(__return_storage_ptr__,(iterator)local_48);
  anon_unknown_0::ToUpper::ToUpper(local_60);
  std::
  transform<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::insert_iterator<std::__cxx11::string>,de::(anonymous_namespace)::ToUpper>
            (local_28,local_30,local_40,local_60[0]);
  return __return_storage_ptr__;
}

Assistant:

string toUpper (const string& str)
{
	string ret;
	std::transform(str.begin(), str.end(), std::inserter(ret, ret.begin()), ToUpper());
	return ret;
}